

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void rsg::anon_unknown_27::fillUndefinedShaderInputs
               (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs)

{
  ValueRangeAccess valueRange;
  bool bVar1;
  reference ppSVar2;
  Variable *this;
  VariableType *this_00;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  in_stack_ffffffffffffffc0;
  ValueRangeAccess local_38;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_20;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_18;
  iterator i;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *inputs_local;
  
  i._M_current = (ShaderInput **)inputs;
  local_18._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(inputs);
  while( true ) {
    local_20._M_current =
         (ShaderInput **)
         std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_18);
    this = ShaderInput::getVariable(*ppSVar2);
    this_00 = rsg::Variable::getType(this);
    bVar1 = VariableType::isSampler(this_00);
    if (!bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                ::operator*(&local_18);
      ShaderInput::getValueRange(&local_38,*ppSVar2);
      valueRange.super_ConstValueRangeAccess.m_min = local_38.super_ConstValueRangeAccess.m_max;
      valueRange.super_ConstValueRangeAccess.m_type =
           (VariableType *)local_38.super_ConstValueRangeAccess.m_min;
      valueRange.super_ConstValueRangeAccess.m_max = (Scalar *)in_stack_ffffffffffffffc0._M_current;
      fillUndefinedComponents(valueRange);
    }
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
         ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void fillUndefinedShaderInputs (vector<ShaderInput*>& inputs)
{
	for (vector<ShaderInput*>::iterator i = inputs.begin(); i != inputs.end(); i++)
	{
		if (!(*i)->getVariable()->getType().isSampler()) // Samplers are assigned at program-level.
			fillUndefinedComponents((*i)->getValueRange());
	}
}